

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDIS.cpp
# Opt level: O1

KBOOL __thiscall
ExampleSubscriber::OnDataReceived
          (ExampleSubscriber *this,KOCTET *Data,KUINT32 DataLength,KString *SenderIp)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Received ",9);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," bytes from ",0xc);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(SenderIp->_M_dataplus)._M_p,SenderIp->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return true;
}

Assistant:

virtual KBOOL OnDataReceived( const KOCTET * Data, KUINT32 DataLength, const KString & SenderIp )
    {
        cout << "Received " << DataLength << " bytes from " << SenderIp << endl;

        // We return true here, if we return false then the data will be discarded by the connection class.
        // This means an IP address based filter could be implemented here.
        return true;
    }